

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_mpi.c
# Opt level: O3

REF_STATUS ref_mpi_start(int argc,char **argv)

{
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_mpi_start(int argc, char *argv[]) {
#ifdef HAVE_MPI
  MPI_Init(&argc, &argv);
#else
  SUPRESS_UNUSED_COMPILER_WARNING(argc);
  SUPRESS_UNUSED_COMPILER_WARNING(argv);
#endif
#ifdef HAVE_KOKKOS
  Kokkos::initialize();
#endif

  return REF_SUCCESS;
}